

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_4::Validator::OnSelectExpr(Validator *this,SelectExpr *expr)

{
  Result rhs;
  size_type sVar1;
  Type *result_types;
  SelectExpr *expr_local;
  Validator *this_local;
  
  sVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&expr->result_type);
  result_types = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::data(&expr->result_type);
  rhs = SharedValidator::OnSelect
                  (&this->validator_,&(expr->super_ExprMixin<(wabt::ExprType)42>).super_Expr.loc,
                   (Index)sVar1,result_types);
  Result::operator|=(&this->result_,rhs);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnSelectExpr(SelectExpr* expr) {
  result_ |= validator_.OnSelect(expr->loc, expr->result_type.size(),
                                 expr->result_type.data());
  return Result::Ok;
}